

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O0

RPCHelpMan * wallet::gethdkeys(void)

{
  initializer_list<RPCArg> __l;
  initializer_list<RPCArg> __l_00;
  initializer_list<RPCResult> __l_01;
  initializer_list<RPCResult> __l_02;
  initializer_list<RPCResult> __l_03;
  initializer_list<RPCResult> __l_04;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_05;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  __l_06;
  RPCHelpMan *in_RDI;
  undefined1 *puVar1;
  long in_FS_OFFSET;
  allocator<RPCArg> *in_stack_ffffffffffffe7e8;
  allocator<RPCArg> *this;
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  *this_00;
  RPCArg *this_01;
  UniValue *in_stack_ffffffffffffe7f0;
  function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *in_stack_ffffffffffffe7f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe818;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe820;
  UniValue *in_stack_ffffffffffffe828;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  *in_stack_ffffffffffffe830;
  undefined7 in_stack_ffffffffffffe838;
  undefined1 in_stack_ffffffffffffe83f;
  string *in_stack_ffffffffffffe840;
  undefined7 in_stack_ffffffffffffe848;
  undefined1 in_stack_ffffffffffffe84f;
  undefined4 in_stack_ffffffffffffe850;
  Type in_stack_ffffffffffffe854;
  string *in_stack_ffffffffffffe858;
  undefined4 in_stack_ffffffffffffe860;
  Type in_stack_ffffffffffffe864;
  undefined4 in_stack_ffffffffffffe868;
  Type in_stack_ffffffffffffe86c;
  RPCArg *in_stack_ffffffffffffe870;
  RPCArgOptions *in_stack_ffffffffffffe890;
  RPCExamples *in_stack_ffffffffffffe930;
  RPCResults *in_stack_ffffffffffffe938;
  vector<RPCArg,_std::allocator<RPCArg>_> *in_stack_ffffffffffffe940;
  string *in_stack_ffffffffffffe948;
  undefined1 *puVar2;
  string *in_stack_ffffffffffffe950;
  RPCHelpMan *in_stack_ffffffffffffe958;
  undefined1 *local_1698;
  undefined1 *local_1680;
  undefined1 *local_1668;
  undefined1 *local_1650;
  undefined1 *local_1638;
  undefined1 *local_1620;
  undefined1 *local_1608;
  RPCMethodImpl *fun;
  undefined1 local_1368 [103];
  allocator<char> local_1301;
  allocator<char> local_1300;
  allocator<char> local_12ff;
  allocator<char> local_12fe;
  allocator<char> local_12fd [2];
  RPCMethodImpl local_12fb;
  allocator<char> local_12da;
  allocator<char> local_12d9 [9];
  undefined8 uStack_12d0;
  _Alloc_hider local_12c8;
  allocator<char> local_12ba;
  allocator<char> local_12b9 [31];
  allocator<char> local_129a;
  allocator<char> local_1299 [31];
  allocator<char> local_127a;
  allocator<char> local_1279;
  pointer local_1278;
  pointer pbStack_1270;
  undefined8 local_1268;
  allocator<char> local_125a;
  allocator<char> local_1259;
  undefined8 local_1258;
  undefined8 uStack_1250;
  undefined8 local_1248;
  allocator<char> local_123a;
  allocator<char> local_1239;
  undefined8 local_1238;
  undefined8 uStack_1230;
  undefined8 local_1228;
  allocator<char> local_121a;
  allocator<char> local_1219 [31];
  allocator<char> local_11fa;
  allocator<char> local_11f9 [31];
  allocator<char> local_11da;
  allocator<char> local_11d9 [27];
  allocator<char> local_11be;
  undefined1 local_11bd;
  allocator<char> local_11bc;
  allocator<char> local_11bb;
  undefined1 local_11ba;
  allocator<char> local_11b9 [32];
  allocator<char> local_1199;
  undefined4 local_1198;
  allocator<char> local_1191 [31];
  allocator<char> local_1172;
  allocator<char> local_1171;
  undefined1 local_1170 [240];
  undefined1 local_1080 [64];
  undefined1 local_1040 [64];
  undefined8 local_1000;
  undefined1 local_f50 [512];
  undefined1 local_d50 [272];
  undefined1 local_c40 [64];
  undefined1 local_c00 [136];
  undefined1 local_b78 [256];
  undefined1 local_a78 [544];
  undefined1 local_858 [64];
  undefined1 local_818 [136];
  undefined1 local_790 [200];
  allocator<RPCArg> local_6c8 [40];
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined1 local_688;
  undefined1 local_687;
  undefined1 local_680;
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined1 local_640;
  undefined1 local_63f;
  undefined1 local_540;
  undefined8 local_518;
  undefined8 uStack_510;
  undefined8 local_508;
  undefined1 local_500;
  undefined1 local_4ff;
  undefined1 local_400 [528];
  undefined1 local_1f0 [160];
  undefined1 local_150 [264];
  undefined1 local_48 [64];
  long local_8;
  
  local_1000 = 0;
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_1198 = 1;
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<RPCArg::Optional,void,void,RPCArg::Optional,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe7f8,&in_stack_ffffffffffffe7f0->typ);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_11ba = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe828,(bool *)in_stack_ffffffffffffe820);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_540 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe800);
  local_518 = 0;
  uStack_510 = 0;
  local_508 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe7e8);
  local_500 = 0;
  local_4ff = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
                 in_stack_ffffffffffffe858,in_stack_ffffffffffffe854,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
                 in_stack_ffffffffffffe840,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_11bd = 0;
  UniValue::UniValue<bool,_bool,_true>(in_stack_ffffffffffffe828,(bool *)in_stack_ffffffffffffe820);
  std::variant<RPCArg::Optional,std::__cxx11::string,UniValue>::
  variant<UniValue,void,void,UniValue,void>
            ((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)in_stack_ffffffffffffe7f8,in_stack_ffffffffffffe7f0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_680 = 0;
  std::__cxx11::string::string(in_stack_ffffffffffffe800);
  local_658 = 0;
  uStack_650 = 0;
  local_648 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe7e8);
  local_640 = 0;
  local_63f = 0;
  RPCArg::RPCArg((RPCArg *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
                 in_stack_ffffffffffffe858,in_stack_ffffffffffffe854,
                 (Fallback *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
                 in_stack_ffffffffffffe840,
                 (RPCArgOptions *)CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838));
  std::allocator<RPCArg>::allocator(in_stack_ffffffffffffe7e8);
  __l._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l._M_array = (iterator)in_stack_ffffffffffffe830;
  __l._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe828,__l,
             (allocator_type *)in_stack_ffffffffffffe820);
  local_6c8[0] = (allocator<RPCArg>)0x0;
  std::__cxx11::string::string(in_stack_ffffffffffffe800);
  local_6a0 = 0;
  uStack_698 = 0;
  local_690 = 0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_stack_ffffffffffffe7e8);
  local_688 = 0;
  local_687 = 0;
  this = local_6c8;
  RPCArg::RPCArg(in_stack_ffffffffffffe870,
                 (string *)CONCAT44(in_stack_ffffffffffffe86c,in_stack_ffffffffffffe868),
                 in_stack_ffffffffffffe864,(Fallback *)in_stack_ffffffffffffe858,
                 (string *)CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
                 (vector<RPCArg,_std::allocator<RPCArg>_> *)
                 CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
                 in_stack_ffffffffffffe890);
  std::allocator<RPCArg>::allocator(this);
  __l_00._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_00._M_array = (iterator)in_stack_ffffffffffffe830;
  __l_00._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe828,__l_00,
             (allocator_type *)in_stack_ffffffffffffe820);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_1238 = 0;
  uStack_1230 = 0;
  local_1228 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_1258 = 0;
  uStack_1250 = 0;
  local_1248 = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_1278 = (pointer)0x0;
  pbStack_1270 = (pointer)0x0;
  local_1268._0_1_ = false;
  local_1268._1_1_ = false;
  local_1268._2_6_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this);
  this_00 = (allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
             *)((ulong)this & 0xffffffff00000000);
  RPCResult::RPCResult
            ((RPCResult *)CONCAT44(in_stack_ffffffffffffe86c,in_stack_ffffffffffffe868),
             in_stack_ffffffffffffe864,in_stack_ffffffffffffe858,
             SUB41(in_stack_ffffffffffffe854 >> 0x18,0),
             (string *)CONCAT17(in_stack_ffffffffffffe84f,in_stack_ffffffffffffe848),
             (vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe840,
             (bool)in_stack_ffffffffffffe83f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_12d9[1] = (allocator<char>)0x0;
  local_12d9[2] = (allocator<char>)0x0;
  local_12d9[3] = (allocator<char>)0x0;
  local_12d9[4] = (allocator<char>)0x0;
  local_12d9[5] = (allocator<char>)0x0;
  local_12d9[6] = (allocator<char>)0x0;
  local_12d9[7] = (allocator<char>)0x0;
  local_12d9[8] = (allocator<char>)0x0;
  uStack_12d0._0_1_ = '\0';
  uStack_12d0._1_7_ = 0;
  local_12c8._M_p = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  local_12fb.super__Function_base._M_functor._3_8_ = 0;
  local_12fb.super__Function_base._11_8_ = 0;
  local_12fb._19_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)this_00);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this_00);
  __l_01._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_01._M_array = (iterator)in_stack_ffffffffffffe830;
  __l_01._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe828,__l_01,
             (allocator_type *)in_stack_ffffffffffffe820);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this_00);
  __l_02._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_02._M_array = (iterator)in_stack_ffffffffffffe830;
  __l_02._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe828,__l_02,
             (allocator_type *)in_stack_ffffffffffffe820);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  fun = &local_12fb;
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this_00);
  __l_03._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_03._M_array = (iterator)in_stack_ffffffffffffe830;
  __l_03._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe828,__l_03,
             (allocator_type *)in_stack_ffffffffffffe820);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  std::allocator<RPCResult>::allocator((allocator<RPCResult> *)this_00);
  __l_04._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_04._M_array = (iterator)in_stack_ffffffffffffe830;
  __l_04._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe828,__l_04,
             (allocator_type *)in_stack_ffffffffffffe820);
  RPCResult::RPCResult
            ((RPCResult *)in_stack_ffffffffffffe870,in_stack_ffffffffffffe86c,
             (string *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860),
             in_stack_ffffffffffffe858,
             (vector<RPCResult,_std::allocator<RPCResult>_> *)
             CONCAT44(in_stack_ffffffffffffe854,in_stack_ffffffffffffe850),
             (bool)in_stack_ffffffffffffe84f);
  RPCResults::RPCResults
            ((RPCResults *)CONCAT44(in_stack_ffffffffffffe86c,in_stack_ffffffffffffe868),
             (RPCResult *)CONCAT44(in_stack_ffffffffffffe864,in_stack_ffffffffffffe860));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  HelpExampleCli(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  HelpExampleRpc(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::operator+(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (in_stack_ffffffffffffe830,(char (*) [12])in_stack_ffffffffffffe828,
             (char (*) [5])in_stack_ffffffffffffe820);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (in_stack_ffffffffffffe830,(char (*) [8])in_stack_ffffffffffffe828,
             (char (*) [5])in_stack_ffffffffffffe820);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this_00);
  __l_05._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_05._M_array = in_stack_ffffffffffffe830;
  __l_05._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffe828,__l_05,(allocator_type *)in_stack_ffffffffffffe820);
  HelpExampleCliNamed(in_stack_ffffffffffffe840,
                      (RPCArgList *)CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838));
  std::operator+(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffe83f,in_stack_ffffffffffffe838),
             (char *)in_stack_ffffffffffffe830,(allocator<char> *)in_stack_ffffffffffffe828);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[12],_const_char_(&)[5],_true>
            (in_stack_ffffffffffffe830,(char (*) [12])in_stack_ffffffffffffe828,
             (char (*) [5])in_stack_ffffffffffffe820);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>::
  pair<const_char_(&)[8],_const_char_(&)[5],_true>
            (in_stack_ffffffffffffe830,(char (*) [8])in_stack_ffffffffffffe828,
             (char (*) [5])in_stack_ffffffffffffe820);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::allocator(this_00);
  __l_06._M_len._0_7_ = in_stack_ffffffffffffe838;
  __l_06._M_array = in_stack_ffffffffffffe830;
  __l_06._M_len._7_1_ = in_stack_ffffffffffffe83f;
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
            *)in_stack_ffffffffffffe828,__l_06,(allocator_type *)in_stack_ffffffffffffe820);
  HelpExampleRpcNamed(&in_stack_ffffffffffffe830->first,(RPCArgList *)in_stack_ffffffffffffe828);
  std::operator+(in_stack_ffffffffffffe820,in_stack_ffffffffffffe818);
  RPCExamples::RPCExamples((RPCExamples *)this_00,(string *)0x162ebee);
  this_01 = (RPCArg *)local_1368;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<wallet::gethdkeys()::__0,void>
            (in_stack_ffffffffffffe7f8,(anon_class_1_0_00000001 *)in_stack_ffffffffffffe7f0);
  RPCHelpMan::RPCHelpMan
            (in_stack_ffffffffffffe958,in_stack_ffffffffffffe950,in_stack_ffffffffffffe948,
             in_stack_ffffffffffffe940,in_stack_ffffffffffffe938,in_stack_ffffffffffffe930,fun);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this_01);
  RPCExamples::~RPCExamples((RPCExamples *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffe7f8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_01);
  local_1608 = local_1080;
  do {
    local_1608 = local_1608 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_01);
  } while (local_1608 != local_1170);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator((allocator<char> *)(local_1368 + 0x46));
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
  ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>_>
             *)in_stack_ffffffffffffe7f8);
  std::
  allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
  ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>_>
                *)this_01);
  local_1620 = local_f50;
  do {
    local_1620 = local_1620 + -0x78;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
             *)this_01);
  } while (local_1620 != local_1040);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1301);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1300);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_12ff);
  std::__cxx11::string::~string(&this_01->m_names);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_12fe);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_12fd);
  RPCResults::~RPCResults((RPCResults *)this_01);
  RPCResult::~RPCResult((RPCResult *)this_01);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1638 = local_790;
  do {
    local_1638 = local_1638 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1638 != local_818);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1650 = local_858;
  do {
    local_1650 = local_1650 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1650 != local_a78);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1668 = local_b78;
  do {
    local_1668 = local_1668 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1668 != local_c00);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this_01);
  local_1680 = local_c40;
  do {
    local_1680 = local_1680 + -0x88;
    RPCResult::~RPCResult((RPCResult *)this_01);
  } while (local_1680 != local_d50);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_12da);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_12d9);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_12ba);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_12b9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_129a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1299);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_127a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1279);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_125a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1259);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_123a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1239);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_ffffffffffffe7f8);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_121a);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1219);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11fa);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_11f9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11da);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_11d9);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  local_1698 = local_48;
  do {
    local_1698 = local_1698 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (local_1698 != local_150);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_ffffffffffffe7f8);
  std::allocator<RPCArg>::~allocator((allocator<RPCArg> *)this_01);
  puVar2 = local_400;
  puVar1 = local_1f0;
  do {
    puVar1 = puVar1 + -0x108;
    RPCArg::~RPCArg(this_01);
  } while (puVar1 != puVar2);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11be);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11bc);
  RPCArgOptions::~RPCArgOptions((RPCArgOptions *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_11bb);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  UniValue::~UniValue((UniValue *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_11b9);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1199);
  std::
  variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
  ::~variant((variant<RPCArg::Optional,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_UniValue>
              *)this_01);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(local_1191);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1172);
  std::__cxx11::string::~string(&this_01->m_names);
  std::allocator<char>::~allocator(&local_1171);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

RPCHelpMan gethdkeys()
{
    return RPCHelpMan{
        "gethdkeys",
        "\nList all BIP 32 HD keys in the wallet and which descriptors use them.\n",
        {
            {"options", RPCArg::Type::OBJ_NAMED_PARAMS, RPCArg::Optional::OMITTED, "", {
                {"active_only", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show the keys for only active descriptors"},
                {"private", RPCArg::Type::BOOL, RPCArg::Default{false}, "Show private keys"}
            }},
        },
        RPCResult{RPCResult::Type::ARR, "", "", {
            {
                {RPCResult::Type::OBJ, "", "", {
                    {RPCResult::Type::STR, "xpub", "The extended public key"},
                    {RPCResult::Type::BOOL, "has_private", "Whether the wallet has the private key for this xpub"},
                    {RPCResult::Type::STR, "xprv", /*optional=*/true, "The extended private key if \"private\" is true"},
                    {RPCResult::Type::ARR, "descriptors", "Array of descriptor objects that use this HD key",
                    {
                        {RPCResult::Type::OBJ, "", "", {
                            {RPCResult::Type::STR, "desc", "Descriptor string representation"},
                            {RPCResult::Type::BOOL, "active", "Whether this descriptor is currently used to generate new addresses"},
                        }},
                    }},
                }},
            }
        }},
        RPCExamples{
            HelpExampleCli("gethdkeys", "") + HelpExampleRpc("gethdkeys", "")
            + HelpExampleCliNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}}) + HelpExampleRpcNamed("gethdkeys", {{"active_only", "true"}, {"private", "true"}})
        },
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue
        {
            const std::shared_ptr<const CWallet> wallet = GetWalletForJSONRPCRequest(request);
            if (!wallet) return UniValue::VNULL;

            if (!wallet->IsWalletFlagSet(WALLET_FLAG_DESCRIPTORS)) {
                throw JSONRPCError(RPC_WALLET_ERROR, "gethdkeys is not available for non-descriptor wallets");
            }

            LOCK(wallet->cs_wallet);

            UniValue options{request.params[0].isNull() ? UniValue::VOBJ : request.params[0]};
            const bool active_only{options.exists("active_only") ? options["active_only"].get_bool() : false};
            const bool priv{options.exists("private") ? options["private"].get_bool() : false};
            if (priv) {
                EnsureWalletIsUnlocked(*wallet);
            }


            std::set<ScriptPubKeyMan*> spkms;
            if (active_only) {
                spkms = wallet->GetActiveScriptPubKeyMans();
            } else {
                spkms = wallet->GetAllScriptPubKeyMans();
            }

            std::map<CExtPubKey, std::set<std::tuple<std::string, bool, bool>>> wallet_xpubs;
            std::map<CExtPubKey, CExtKey> wallet_xprvs;
            for (auto* spkm : spkms) {
                auto* desc_spkm{dynamic_cast<DescriptorScriptPubKeyMan*>(spkm)};
                CHECK_NONFATAL(desc_spkm);
                LOCK(desc_spkm->cs_desc_man);
                WalletDescriptor w_desc = desc_spkm->GetWalletDescriptor();

                // Retrieve the pubkeys from the descriptor
                std::set<CPubKey> desc_pubkeys;
                std::set<CExtPubKey> desc_xpubs;
                w_desc.descriptor->GetPubKeys(desc_pubkeys, desc_xpubs);
                for (const CExtPubKey& xpub : desc_xpubs) {
                    std::string desc_str;
                    bool ok = desc_spkm->GetDescriptorString(desc_str, false);
                    CHECK_NONFATAL(ok);
                    wallet_xpubs[xpub].emplace(desc_str, wallet->IsActiveScriptPubKeyMan(*spkm), desc_spkm->HasPrivKey(xpub.pubkey.GetID()));
                    if (std::optional<CKey> key = priv ? desc_spkm->GetKey(xpub.pubkey.GetID()) : std::nullopt) {
                        wallet_xprvs[xpub] = CExtKey(xpub, *key);
                    }
                }
            }

            UniValue response(UniValue::VARR);
            for (const auto& [xpub, descs] : wallet_xpubs) {
                bool has_xprv = false;
                UniValue descriptors(UniValue::VARR);
                for (const auto& [desc, active, has_priv] : descs) {
                    UniValue d(UniValue::VOBJ);
                    d.pushKV("desc", desc);
                    d.pushKV("active", active);
                    has_xprv |= has_priv;

                    descriptors.push_back(std::move(d));
                }
                UniValue xpub_info(UniValue::VOBJ);
                xpub_info.pushKV("xpub", EncodeExtPubKey(xpub));
                xpub_info.pushKV("has_private", has_xprv);
                if (priv) {
                    xpub_info.pushKV("xprv", EncodeExtKey(wallet_xprvs.at(xpub)));
                }
                xpub_info.pushKV("descriptors", std::move(descriptors));

                response.push_back(std::move(xpub_info));
            }

            return response;
        },
    };
}